

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O1

void DrawStatLine(int x,int *y,char *prefix,char *string)

{
  FFont *font;
  undefined4 in_register_0000003c;
  int *piVar1;
  int y_00;
  
  font = SmallFont;
  piVar1 = (int *)CONCAT44(in_register_0000003c,x);
  y_00 = (*piVar1 - SmallFont->FontHeight) + 1;
  *piVar1 = y_00;
  DCanvas::DrawText((DCanvas *)screen,font,hudcolor_statnames.Value,5,y_00,(char *)y,0x400013a8,1,
                    0x40001399,(ulong)(uint)hudwidth,0x4000139a,(ulong)(uint)hudheight,0x4000138b,
                    0xc000,0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,hudcolor_stats.Value,statspace + 5,*piVar1,prefix,
                    0x400013a8,1,0x40001399,(ulong)(uint)hudwidth,0x4000139a,(ulong)(uint)hudheight,
                    0x4000138b,0xc000,0);
  return;
}

Assistant:

static void DrawStatLine(int x, int &y, const char *prefix, const char *string)
{
	y -= SmallFont->GetHeight()-1;
	screen->DrawText(SmallFont, hudcolor_statnames, x, y, prefix, 
		DTA_KeepRatio, true,
		DTA_VirtualWidth, hudwidth, DTA_VirtualHeight, hudheight, DTA_Alpha, 0xc000, TAG_DONE);

	screen->DrawText(SmallFont, hudcolor_stats, x+statspace, y, string,
		DTA_KeepRatio, true,
		DTA_VirtualWidth, hudwidth, DTA_VirtualHeight, hudheight, DTA_Alpha, 0xc000, TAG_DONE);
}